

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall clinet::send_message(clinet *this,int msgid,void *body,int len)

{
  int msgid_local;
  iobuf bufs [2];
  
  bufs[0].data = &msgid_local;
  bufs[0].len = 4;
  msgid_local = msgid;
  bufs[1].data = body;
  bufs[1].len = len;
  (*this->network_->_vptr_inetwork[4])(this->network_,(ulong)(uint)this->netid_,bufs,2);
  return;
}

Assistant:

void send_message(int msgid, void* body, int len)
    {
        iobuf bufs[2];
        bufs[0].data = &msgid;
        bufs[0].len = sizeof(msgid);
        bufs[1].data = body;
        bufs[1].len = len;
        network_->sendv(netid_, bufs, 2);
    }